

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JaegerPropagator.h
# Opt level: O0

SpanContext * __thiscall
jaegertracing::propagation::
JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
doExtract(SpanContext *__return_storage_ptr__,
         JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
         *this,TextMapReader *reader)

{
  __node_base_ptr *pp_Var1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar2;
  uchar flags;
  error_type *__lhs;
  element_type *this_01;
  Counter *pCVar3;
  TraceID *traceID;
  uint64_t spanID;
  uint64_t parentID;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  undefined4 local_1a0;
  anon_class_24_3_675ae04c local_190;
  function<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view)>
  local_178;
  expected<void,_std::error_code> local_158;
  undefined1 local_140 [8];
  expected<void,_std::error_code> result;
  StrMap baggage;
  SpanContext ctx;
  TextMapReader *reader_local;
  JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
  *this_local;
  
  pp_Var1 = &baggage._M_h._M_single_bucket;
  SpanContext::SpanContext((SpanContext *)pp_Var1);
  this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&result.contained + 8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(this_00);
  local_190.this = this;
  local_190.ctx = (SpanContext *)pp_Var1;
  local_190.baggage = this_00;
  std::
  function<opentracing::v3::expected<void,std::error_code>(opentracing::v3::string_view,opentracing::v3::string_view)>
  ::
  function<jaegertracing::propagation::JaegerPropagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>::doExtract(opentracing::v3::TextMapReader_const&)const::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_,void>
            ((function<opentracing::v3::expected<void,std::error_code>(opentracing::v3::string_view,opentracing::v3::string_view)>
              *)&local_178,&local_190);
  (**(code **)(*(long *)reader + 0x18))(&local_158,reader,&local_178);
  opentracing::v3::expected<void,_std::error_code>::expected<true,_0>
            ((expected<void,_std::error_code> *)local_140,&local_158);
  opentracing::v3::expected<void,_std::error_code>::~expected(&local_158);
  std::
  function<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view)>
  ::~function(&local_178);
  bVar2 = opentracing::v3::expected::operator_cast_to_bool((expected *)local_140);
  if (!bVar2) {
    __lhs = opentracing::v3::expected<void,_std::error_code>::error
                      ((expected<void,_std::error_code> *)local_140);
    bVar2 = std::operator==(__lhs,(error_code *)opentracing::v3::span_context_corrupted_error);
    if (bVar2) {
      this_01 = std::
                __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->
                                 super_Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                                 )._metrics);
      pCVar3 = metrics::Metrics::decodingErrors(this_01);
      (*pCVar3->_vptr_Counter[2])(pCVar3,1);
      SpanContext::SpanContext(__return_storage_ptr__);
      goto LAB_0037c903;
    }
  }
  pp_Var1 = &baggage._M_h._M_single_bucket;
  traceID = SpanContext::traceID((SpanContext *)pp_Var1);
  spanID = SpanContext::spanID((SpanContext *)pp_Var1);
  parentID = SpanContext::parentID((SpanContext *)pp_Var1);
  flags = SpanContext::flags((SpanContext *)pp_Var1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"",&local_1e9);
  SpanContext::SpanContext
            (__return_storage_ptr__,traceID,spanID,parentID,flags,
             (StrMap *)((long)&result.contained + 8),&local_1c0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
LAB_0037c903:
  local_1a0 = 1;
  opentracing::v3::expected<void,_std::error_code>::~expected
            ((expected<void,_std::error_code> *)local_140);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&result.contained + 8));
  SpanContext::~SpanContext((SpanContext *)&baggage._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

SpanContext doExtract(const Reader& reader) const override
    {
        SpanContext ctx;
        StrMap baggage;
        const auto result =
            reader.ForeachKey([this, &ctx, &baggage](const std::string& rawKey,
                                                     const std::string& value) {
                const auto key = this->normalizeKey(rawKey);
                if (key == this->_headerKeys.traceContextHeaderName()) {
                    const auto safeValue = this->decodeValue(value);
                    std::istringstream iss(safeValue);
                    if (!(iss >> ctx) || ctx == SpanContext()) {
                        return opentracing::make_expected_from_error<void>(
                            opentracing::span_context_corrupted_error);
                    }
                }
                else if (key == this->_headerKeys.jaegerBaggageHeader()) {
                    for (auto&& pair : parseCommaSeparatedMap(value)) {
                        baggage[pair.first] = pair.second;
                    }
                }
                else {
                    const auto prefix =
                        this->_headerKeys.traceBaggageHeaderPrefix();
                    if (key.size() >= prefix.size() &&
                        key.substr(0, prefix.size()) == prefix) {
                        const auto safeKey = removeBaggageKeyPrefix(key);
                        const auto safeValue = this->decodeValue(value);
                        baggage[safeKey] = safeValue;
                    }
                }

                return opentracing::make_expected();
            });

        if (!result &&
            result.error() == opentracing::span_context_corrupted_error) {
            this->_metrics->decodingErrors().inc(1);
            return SpanContext();
        }

        return SpanContext(
            ctx.traceID(), ctx.spanID(), ctx.parentID(), ctx.flags(), baggage);
    }